

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O1

void address_space_stl_be_aarch64
               (uc_struct_conflict2 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  uint *puVar2;
  hwaddr addr1;
  hwaddr l;
  hwaddr local_38;
  hwaddr local_30;
  
  local_30 = 4;
  mr = flatview_translate_aarch64(uc,as->current_map,addr,&local_38,&local_30,true,attrs);
  if (((local_30 < 4) || (mr->ram != true)) || (mr->readonly == true)) {
    MVar1 = memory_region_dispatch_write_aarch64(uc,mr,local_38,(ulong)val,MO_BEUL,attrs);
  }
  else {
    puVar2 = (uint *)qemu_map_ram_ptr_aarch64((uc_struct_conflict2 *)mr->uc,mr->ram_block,local_38);
    *puVar2 = val >> 0x18 | (val & 0xff0000) >> 8 | (val & 0xff00) << 8 | val << 0x18;
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

void glue(address_space_stl_be, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    glue(address_space_stl_internal, SUFFIX)(uc, ARG1, addr, val, attrs,
                                             result, DEVICE_BIG_ENDIAN);
}